

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::Int64Parameter::_InternalSerialize
          (Int64Parameter *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  Int64Range *this_00;
  Int64Set *this_01;
  void *data;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  int size;
  ulong uVar6;
  uint8_t *puVar7;
  size_t __n;
  
  uVar4 = this->defaultvalue_;
  puVar7 = target;
  if (uVar4 != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar4 = this->defaultvalue_;
    }
    *target = '\b';
    target[1] = (byte)uVar4;
    if (uVar4 < 0x80) {
      puVar7 = target + 2;
    }
    else {
      target[1] = (byte)uVar4 | 0x80;
      target[2] = (uint8_t)(uVar4 >> 7);
      puVar7 = target + 3;
      if (0x3fff < uVar4) {
        uVar6 = (ulong)target[2];
        uVar4 = uVar4 >> 7;
        do {
          puVar7[-1] = (byte)uVar6 | 0x80;
          uVar5 = uVar4 >> 7;
          *puVar7 = (uint8_t)uVar5;
          puVar7 = puVar7 + 1;
          uVar6 = uVar5 & 0xffffffff;
          bVar2 = 0x3fff < uVar4;
          uVar4 = uVar5;
        } while (bVar2);
      }
    }
  }
  uVar3 = this->_oneof_case_[0];
  if (uVar3 == 10) {
    if (stream->end_ <= puVar7) {
      puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar7);
    }
    this_00 = (this->AllowedValues_).range_;
    *puVar7 = 'R';
    uVar1 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar7[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar7 = puVar7 + 2;
    }
    else {
      puVar7 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,puVar7 + 1);
    }
    puVar7 = Int64Range::_InternalSerialize(this_00,puVar7,stream);
    uVar3 = this->_oneof_case_[0];
  }
  if (uVar3 == 0xb) {
    if (stream->end_ <= puVar7) {
      puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar7);
    }
    this_01 = (this->AllowedValues_).set_;
    *puVar7 = 'Z';
    uVar1 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar7[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar7 = puVar7 + 2;
    }
    else {
      puVar7 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,puVar7 + 1);
    }
    puVar7 = Int64Set::_InternalSerialize(this_01,puVar7,stream);
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    uVar4 = uVar4 & 0xfffffffffffffffc;
    data = *(void **)(uVar4 + 8);
    size = (int)*(undefined8 *)(uVar4 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)puVar7 < (long)__n) {
      puVar7 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,puVar7);
      return puVar7;
    }
    memcpy(puVar7,data,__n);
    puVar7 = puVar7 + __n;
  }
  return puVar7;
}

Assistant:

uint8_t* Int64Parameter::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.Int64Parameter)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 defaultValue = 1;
  if (this->_internal_defaultvalue() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(1, this->_internal_defaultvalue(), target);
  }

  // .CoreML.Specification.Int64Range range = 10;
  if (_internal_has_range()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        10, _Internal::range(this), target, stream);
  }

  // .CoreML.Specification.Int64Set set = 11;
  if (_internal_has_set()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        11, _Internal::set(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.Int64Parameter)
  return target;
}